

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_2,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,4,2>
          (Matrix<float,_2,_4> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_2> *a,
          Vector<float,_4> *b)

{
  float fVar1;
  int r;
  long lVar2;
  long lVar3;
  Matrix<float,_4,_2> *mat;
  tcu *this_00;
  Matrix<float,_4,_2> retVal;
  tcu local_40 [32];
  
  this_00 = local_40;
  tcu::Matrix<float,_4,_2>::Matrix((Matrix<float,_4,_2> *)this_00);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    fVar1 = a->m_data[lVar2];
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
      *(float *)(this_00 + lVar3 * 4) = *(float *)(this + lVar3) * fVar1;
    }
    this_00 = this_00 + 4;
  }
  tcu::transpose<float,4,2>(__return_storage_ptr__,local_40,mat);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}